

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode InitiateTransfer(connectdata *conn)

{
  Curl_easy *data_00;
  CURLcode CVar1;
  CURLcode result;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if ((*(uint *)&(conn->bits).field_0x4 >> 0x13 & 1) != 0) {
    Curl_infof(data_00,"Doing the SSL/TLS handshake on the data stream\n");
    CVar1 = Curl_ssl_connect(conn,1);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if ((conn->proto).ftpc.state_saved == FTP_STOR) {
    Curl_pgrsSetUploadSize(data_00,(data_00->state).infilesize);
    Curl_setup_transfer(data_00,-1,-1,false,1);
  }
  else {
    Curl_setup_transfer(data_00,1,(conn->proto).ftpc.retr_size_saved,false,-1);
  }
  (conn->proto).sshc.authed = true;
  _state(conn,FTP_STOP);
  return CURLE_OK;
}

Assistant:

static CURLcode InitiateTransfer(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;

  if(conn->bits.ftp_use_data_ssl) {
    /* since we only have a plaintext TCP connection here, we must now
     * do the TLS stuff */
    infof(data, "Doing the SSL/TLS handshake on the data stream\n");
    result = Curl_ssl_connect(conn, SECONDARYSOCKET);
    if(result)
      return result;
  }

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we're uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbufset(conn->sock[SECONDARYSOCKET]);

    Curl_setup_transfer(data, -1, -1, FALSE, SECONDARYSOCKET);
  }
  else {
    /* FTP download: */
    Curl_setup_transfer(data, SECONDARYSOCKET,
                        conn->proto.ftpc.retr_size_saved, FALSE, -1);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  state(conn, FTP_STOP);

  return CURLE_OK;
}